

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O3

void __thiscall
IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,MethodInvocation *method_invocation)

{
  MethodExpression *pMVar1;
  pointer ppEVar2;
  pointer pcVar3;
  CallExpression *this_00;
  int iVar4;
  ExpressionList *this_01;
  Expression *expression;
  ExpressionWrapper *pEVar5;
  undefined4 extraout_var;
  SubtreeWrapper *pSVar6;
  undefined4 extraout_var_00;
  NameExpression *this_02;
  long *plVar7;
  size_type *psVar8;
  pointer ppEVar9;
  Symbol class_name;
  Symbol local_120;
  string local_100;
  NameExpression *local_e0;
  CallExpression *local_d8;
  Symbol local_d0;
  string local_b0;
  string local_90;
  Label local_70;
  string local_50;
  
  this_01 = (ExpressionList *)operator_new(0x20);
  (this_01->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__ExpressionList_0016cf38;
  (this_01->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expression = IRT::FrameTranslator::GetAddress(this->current_frame_,&method_invocation->call_from_)
  ;
  pEVar5 = (ExpressionWrapper *)operator_new(0x10);
  IRT::ExpressionWrapper::ExpressionWrapper(pEVar5,expression);
  iVar4 = (*(pEVar5->super_SubtreeWrapper)._vptr_SubtreeWrapper[2])(pEVar5);
  IRT::ExpressionList::Add(this_01,(Expression *)CONCAT44(extraout_var,iVar4));
  pMVar1 = method_invocation->arguments_list_;
  if (pMVar1 != (MethodExpression *)0x0) {
    ppEVar2 = (pMVar1->list_of_expressions_).
              super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppEVar9 = (pMVar1->list_of_expressions_).
                   super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppEVar9 != ppEVar2; ppEVar9 = ppEVar9 + 1) {
      pSVar6 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                         (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                          &(*ppEVar9)->super_Node);
      iVar4 = (*pSVar6->_vptr_SubtreeWrapper[2])(pSVar6);
      IRT::ExpressionList::Add(this_01,(Expression *)CONCAT44(extraout_var_00,iVar4));
    }
  }
  local_d0.name_._M_dataplus._M_p = (pointer)&local_d0.name_.field_2;
  local_d0.name_._M_string_length = 0;
  local_d0.name_.field_2._M_local_buf[0] = '\0';
  iVar4 = std::__cxx11::string::compare((char *)&method_invocation->call_from_);
  if (iVar4 == 0) {
    std::__cxx11::string::_M_assign((string *)&local_d0);
  }
  else {
    pcVar3 = (method_invocation->call_from_)._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + (method_invocation->call_from_)._M_string_length)
    ;
    Symbol::Symbol(&local_120,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    TypeResolving_abi_cxx11_(&local_50,this,&local_120);
    Symbol::Symbol((Symbol *)&local_100,&local_50);
    std::__cxx11::string::_M_assign((string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.name_._M_dataplus._M_p != &local_120.name_.field_2) {
      operator_delete(local_120.name_._M_dataplus._M_p,
                      local_120.name_.field_2._M_allocated_capacity + 1);
    }
  }
  pEVar5 = (ExpressionWrapper *)operator_new(0x10);
  local_d8 = (CallExpression *)operator_new(0x18);
  this_02 = (NameExpression *)operator_new(0x28);
  Symbol::GetName_abi_cxx11_(&local_100,&local_d0);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_120.name_._M_dataplus._M_p = (pointer)&local_120.name_.field_2;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_120.name_.field_2._M_allocated_capacity = *psVar8;
    local_120.name_.field_2._8_8_ = plVar7[3];
  }
  else {
    local_120.name_.field_2._M_allocated_capacity = *psVar8;
    local_120.name_._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_120.name_._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_e0 = this_02;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_120,
                              (ulong)(method_invocation->method_name_)._M_dataplus._M_p);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0.field_2._8_8_ = plVar7[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_b0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  IRT::Label::Label(&local_70,&local_b0);
  this_00 = local_d8;
  IRT::NameExpression::NameExpression(this_02,&local_70);
  IRT::CallExpression::CallExpression(this_00,&local_e0->super_Expression,this_01);
  IRT::ExpressionWrapper::ExpressionWrapper(pEVar5,&this_00->super_Expression);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pEVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.label_._M_dataplus._M_p != &local_70.label_.field_2) {
    operator_delete(local_70.label_._M_dataplus._M_p,
                    local_70.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.name_._M_dataplus._M_p != &local_120.name_.field_2) {
    operator_delete(local_120.name_._M_dataplus._M_p,
                    local_120.name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name_._M_dataplus._M_p != &local_d0.name_.field_2) {
    operator_delete(local_d0.name_._M_dataplus._M_p,
                    CONCAT71(local_d0.name_.field_2._M_allocated_capacity._1_7_,
                             local_d0.name_.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(MethodInvocation* method_invocation) {
  auto* irt_expressions = new IRT::ExpressionList();

  auto address = current_frame_->GetAddress(method_invocation->call_from_);
  irt_expressions->Add((new IRT::ExpressionWrapper(address))->ToExpression());

  if (method_invocation->arguments_list_ != nullptr) {
    for (auto expr : method_invocation->arguments_list_->list_of_expressions_) {
      irt_expressions->Add(Accept(expr)->ToExpression());
    }
  }

  Symbol class_name;
  if (method_invocation->call_from_ == "this") {
    class_name = current_layer_->class_symbol_;
  } else {
    const Symbol& symbol = Symbol(method_invocation->call_from_);

    class_name = Symbol(TypeResolving(symbol));
  }

  tos_value_ = new IRT::ExpressionWrapper(new IRT::CallExpression(
      new IRT::NameExpression(IRT::Label(
          class_name.GetName() + "_" + method_invocation->method_name_)),
      irt_expressions));
}